

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseIncoming.cpp
# Opt level: O3

Result __thiscall tonk::SessionIncoming::attemptDecode(SessionIncoming *this)

{
  ostringstream *poVar1;
  uchar *puVar2;
  SiameseResult SVar3;
  OutputWorker *pOVar4;
  RefCounter *pRVar5;
  Result *success;
  SessionIncoming *pSVar6;
  SiameseOriginalPacket *in_RSI;
  ulong uVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  uint recoveredOriginalCount;
  SiameseOriginalPacket *recoveredOriginals;
  uint64_t stats [11];
  uint local_22c;
  SessionIncoming *local_228;
  SiameseOriginalPacket *local_220;
  string local_218;
  long local_1e0;
  long local_1d8;
  undefined1 local_1c0 [8];
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  local_228 = this;
  do {
    SVar3 = siamese_decoder_is_ready((SiameseDecoder)in_RSI[0x26].Data);
    if (SVar3 != Siamese_Success) {
      if (SVar3 == Siamese_NeedMoreData) {
LAB_0012944d:
        (local_228->Deps).ConnectionRef = (RefCounter *)0x0;
        pSVar6 = local_228;
      }
      else {
        local_1b8._0_8_ = (IIncomingHandler *)(local_1b8 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b8,"siamese_decoder_is_ready failed","");
        pRVar5 = (RefCounter *)operator_new(0x38);
        *(char **)pRVar5 = "SessionIncoming::decoderAddOriginal";
        (pRVar5->ShutdownJson)._M_dataplus._M_p = (pointer)&(pRVar5->ShutdownJson).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pRVar5->ShutdownJson,local_1b8._0_8_,
                   (undefined1 *)
                   ((long)(_func_int ***)local_1b8._0_8_ +
                   CONCAT44(local_1b8._12_4_,local_1b8._8_4_)));
        pSVar6 = local_228;
        (pRVar5->RefCount).super___atomic_base<int>._M_i = 1;
        *(long *)&(pRVar5->ShutdownLock).super___mutex_base._M_mutex = (long)(int)SVar3;
        (local_228->Deps).ConnectionRef = pRVar5;
        if ((IIncomingHandler *)local_1b8._0_8_ != (IIncomingHandler *)(local_1b8 + 0x10)) {
          operator_delete((void *)local_1b8._0_8_);
        }
        puVar2 = in_RSI[2].Data;
        Result::ToJson_abi_cxx11_(&local_218,(Result *)pSVar6);
        if (*(int *)(puVar2 + 8) < 5) {
          local_1b8._0_8_ = *(undefined8 *)puVar2;
          poVar1 = (ostringstream *)(local_1b8 + 0x10);
          local_1b8._8_4_ = Error;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,*(char **)(puVar2 + 0x38),*(long *)(puVar2 + 0x40));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"siamese_decoder_is_ready failed: ",0x21);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,local_218._M_dataplus._M_p,local_218._M_string_length);
          pOVar4 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_1b8);
LAB_00129574:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 0x10));
          std::ios_base::~ios_base(local_138);
        }
LAB_00129590:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p);
        }
      }
      return (Result)(ErrorResult *)pSVar6;
    }
    local_220 = (SiameseOriginalPacket *)0x0;
    local_22c = 0;
    SVar3 = siamese_decode((SiameseDecoder)in_RSI[0x26].Data,&local_220,&local_22c);
    if (local_22c != 0) {
      uVar7 = 0;
      do {
        onSiameseSolved((SessionIncoming *)local_1c0,in_RSI);
        Result::~Result((Result *)local_1c0);
        uVar7 = uVar7 + 1;
      } while (uVar7 < local_22c);
    }
    pSVar6 = local_228;
    if (SVar3 != Siamese_Success) {
      if (SVar3 == Siamese_NeedMoreData) {
        siamese_decoder_stats((SiameseDecoder)in_RSI[0x26].Data,(uint64_t *)&local_218,0xb);
        puVar2 = in_RSI[2].Data;
        if (*(int *)(puVar2 + 8) < 2) {
          local_1b8._0_8_ = *(undefined8 *)puVar2;
          poVar1 = (ostringstream *)(local_1b8 + 0x10);
          local_1b8._8_4_ = Debug;
          auVar11 = std::__cxx11::ostringstream::ostringstream(poVar1);
          auVar10._0_8_ = auVar11._8_8_;
          auVar8._0_8_ = auVar11._0_8_;
          auVar10._8_56_ = extraout_var_00;
          auVar9 = auVar10._0_16_;
          auVar8._8_56_ = extraout_var;
          auVar11 = auVar8._0_16_;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,*(char **)(puVar2 + 0x38),*(long *)(puVar2 + 0x40));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"Recovery failed and needs more data (rare): Failure rate = "
                     ,0x3b);
          auVar11 = vcvtusi2ss_avx512f(auVar11,local_1d8);
          auVar9 = vcvtusi2ss_avx512f(auVar9,local_1e0 + local_1d8);
          std::ostream::_M_insert<double>
                    ((double)((ulong)(local_1d8 != 0) * (long)(double)(auVar11._0_4_ / auVar9._0_4_)
                             ));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," solveFailCount=",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," successCount = ",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          pOVar4 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_1b8);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
        }
        goto LAB_0012944d;
      }
      local_1b8._0_8_ = (IIncomingHandler *)(local_1b8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"siamese_decode failed","");
      pRVar5 = (RefCounter *)operator_new(0x38);
      *(char **)pRVar5 = "SessionIncoming::decoderAddOriginal";
      (pRVar5->ShutdownJson)._M_dataplus._M_p = (pointer)&(pRVar5->ShutdownJson).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pRVar5->ShutdownJson,local_1b8._0_8_,
                 (undefined1 *)
                 ((long)(_func_int ***)local_1b8._0_8_ + CONCAT44(local_1b8._12_4_,local_1b8._8_4_))
                );
      pSVar6 = local_228;
      (pRVar5->RefCount).super___atomic_base<int>._M_i = 1;
      *(long *)&(pRVar5->ShutdownLock).super___mutex_base._M_mutex = (long)(int)SVar3;
      (local_228->Deps).ConnectionRef = pRVar5;
      if ((IIncomingHandler *)local_1b8._0_8_ != (IIncomingHandler *)(local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_);
      }
      puVar2 = in_RSI[2].Data;
      Result::ToJson_abi_cxx11_(&local_218,(Result *)pSVar6);
      if (4 < *(int *)(puVar2 + 8)) goto LAB_00129590;
      local_1b8._0_8_ = *(undefined8 *)puVar2;
      poVar1 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,*(char **)(puVar2 + 0x38),*(long *)(puVar2 + 0x40));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"siamese_decode failed: ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,local_218._M_dataplus._M_p,local_218._M_string_length);
      pOVar4 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_1b8);
      goto LAB_00129574;
    }
    resumeProcessing(local_228);
    if ((pSVar6->Deps).ConnectionRef != (RefCounter *)0x0) {
      return (Result)(ErrorResult *)pSVar6;
    }
    Result::~Result((Result *)pSVar6);
  } while( true );
}

Assistant:

Result SessionIncoming::attemptDecode()
{
    // Run decode loop
    for (;;)
    {
        // Check if decoder is ready
        const int readyResult = siamese_decoder_is_ready(FECDecoder);

        if (readyResult == Siamese_NeedMoreData) {
            break;
        }

        if (readyResult != Siamese_Success)
        {
            Result result = Result("SessionIncoming::decoderAddOriginal", "siamese_decoder_is_ready failed", ErrorType::Siamese, readyResult);
            Deps.Logger->Error("siamese_decoder_is_ready failed: ", result.ToJson());
            return result;
        }

        SiameseOriginalPacket* recoveredOriginals = nullptr;
        unsigned recoveredOriginalCount = 0;

        // Attempt to decode
        const int decodeResult = siamese_decode(FECDecoder, &recoveredOriginals, &recoveredOriginalCount);

        // Handle any Unordered/Unreliable messages as they are decoded
        for (unsigned i = 0; i < recoveredOriginalCount; ++i) {
            onSiameseSolved(recoveredOriginals[i]);
        }

        if (decodeResult == Siamese_NeedMoreData)
        {
            uint64_t stats[SiameseDecoderStats_Count];
            siamese_decoder_stats(FECDecoder, stats, SiameseDecoderStats_Count);

            uint64_t solveFailCount = stats[SiameseDecoderStats_SolveFailCount];
            uint64_t successCount = stats[SiameseDecoderStats_SolveSuccessCount];

            float failRate = 0.f;
            if (solveFailCount > 0) {
                failRate = solveFailCount / (float)(solveFailCount + successCount);
            }
            Deps.Logger->Debug("Recovery failed and needs more data (rare): Failure rate = ", failRate, " solveFailCount=", solveFailCount, " successCount = ", successCount);

            break;
        }

        if (decodeResult != Siamese_Success)
        {
            Result result = Result("SessionIncoming::decoderAddOriginal", "siamese_decode failed", ErrorType::Siamese, decodeResult);
            Deps.Logger->Error("siamese_decode failed: ", result.ToJson());
            return result;
        }

        //Deps.Logger->Debug("SIAMESE RECOVERED: ", recoveredOriginalCount);

        // Resume processing
        Result result = resumeProcessing();
        if (result.IsFail()) {
            return result;
        }
    }

    return Result::Success();
}